

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_bpf_reinit__internal(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF,ma_bool32 isNew)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  ma_result mVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ma_bpf_heap_layout heapLayout;
  ma_bpf_heap_layout local_68;
  double local_58;
  ma_bpf2_config local_50;
  
  if ((pConfig != (ma_bpf_config *)0x0 && pBPF != (ma_bpf *)0x0) &&
     ((mVar1 = pConfig->format, mVar1 == ma_format_f32 || (mVar1 == ma_format_s16)))) {
    if (pBPF->format != ma_format_unknown && pBPF->format != mVar1) {
      return MA_INVALID_OPERATION;
    }
    if ((pBPF->channels != 0) && (pBPF->channels != pConfig->channels)) {
      return MA_INVALID_OPERATION;
    }
    uVar4 = pConfig->order;
    uVar5 = (ulong)uVar4;
    if ((uVar4 & 1) == 0 && uVar5 < 9) {
      uVar4 = uVar4 >> 1;
      if (isNew == 0) {
        if (pBPF->bpf2Count != uVar4) {
          return MA_INVALID_OPERATION;
        }
        local_68.sizeInBytes = 0;
        local_68.bpf2Offset = 0;
      }
      else {
        mVar3 = ma_bpf_get_heap_layout(pConfig,&local_68);
        if (mVar3 != MA_SUCCESS) {
          return mVar3;
        }
        pBPF->_pHeap = pHeap;
        if (local_68.sizeInBytes != 0) {
          memset(pHeap,0,local_68.sizeInBytes);
        }
        pBPF->pBPF2 = (ma_bpf2 *)(local_68.bpf2Offset + (long)pHeap);
      }
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          local_50._8_8_ = ZEXT48(pConfig->sampleRate);
          local_50.cutoffFrequency = pConfig->cutoffFrequency;
          local_50.format = pConfig->format;
          local_50.channels = pConfig->channels;
          local_50.q = 0.707107;
          if (isNew == 0) {
            mVar3 = ma_bpf2_reinit(&local_50,pBPF->pBPF2 + uVar6);
          }
          else {
            local_58 = (local_50.cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
            sin(local_58);
            sin(1.5707963267948966 - local_58);
            if ((ulong)local_50._0_8_ >> 0x20 == 0) {
              return MA_INVALID_ARGS;
            }
            mVar3 = ma_bpf2_init_preallocated
                              (&local_50,
                               (void *)((long)pHeap +
                                       ((ulong)local_50._0_8_ >> 0x20) * uVar6 * 8 +
                                       local_68.bpf2Offset + uVar5 * 0x20),pBPF->pBPF2 + uVar6);
          }
          if (mVar3 != MA_SUCCESS) {
            return mVar3;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar4 + (uVar4 == 0));
      }
      pBPF->bpf2Count = uVar4;
      mVar2 = pConfig->channels;
      pBPF->format = pConfig->format;
      pBPF->channels = mVar2;
      return MA_SUCCESS;
    }
  }
  return MA_INVALID_ARGS;
}

Assistant:

static ma_result ma_bpf_reinit__internal(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;
    ma_bpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pBPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBPF->format != ma_format_unknown && pBPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBPF->channels != 0 && pBPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->order / 2;

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pBPF->bpf2Count != bpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pBPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pBPF->pBPF2 = (ma_bpf2*)ma_offset_ptr(pHeap, heapLayout.bpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);
    }

    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        ma_bpf2_config bpf2Config;
        double q;

        /* TODO: Calculate Q to make this a proper Butterworth filter. */
        q = 0.707107;

        bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t bpf2HeapSizeInBytes;

            result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_bpf2_init_preallocated(&bpf2Config, ma_offset_ptr(pHeap, heapLayout.bpf2Offset + (sizeof(ma_bpf2) * bpf2Count) + (ibpf2 * bpf2HeapSizeInBytes)), &pBPF->pBPF2[ibpf2]);
            }
        } else {
            result = ma_bpf2_reinit(&bpf2Config, &pBPF->pBPF2[ibpf2]);
        }

        if (result != MA_SUCCESS) {
            return result;
        }
    }

    pBPF->bpf2Count = bpf2Count;
    pBPF->format    = pConfig->format;
    pBPF->channels  = pConfig->channels;

    return MA_SUCCESS;
}